

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_generated.h
# Opt level: O3

bool __thiscall reflection::Service::Verify(Service *this,Verifier *verifier)

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  String *pSVar4;
  Vector<flatbuffers::Offset<reflection::RPCCall>,_unsigned_int> *vec;
  Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *vec_00;
  Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *vec_01;
  
  bVar1 = flatbuffers::VerifierTemplate<false>::VerifyTableStart(verifier,(uint8_t *)this);
  if ((bVar1) &&
     (bVar1 = flatbuffers::Table::VerifyOffsetRequired<unsigned_int>(&this->super_Table,verifier,4),
     bVar1)) {
    if ((*(ushort *)(this + -(long)*(int *)this) < 5) ||
       (uVar2 = (ulong)*(ushort *)(this + (4 - (long)*(int *)this)), uVar2 == 0)) {
      pSVar4 = (String *)0x0;
    }
    else {
      pSVar4 = (String *)(this + *(uint *)(this + uVar2) + uVar2);
    }
    bVar1 = flatbuffers::VerifierTemplate<false>::VerifyString(verifier,pSVar4);
    if ((bVar1) &&
       (bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>(&this->super_Table,verifier,6), bVar1
       )) {
      lVar3 = -(long)*(int *)this;
      if ((6 < *(ushort *)(this + -(long)*(int *)this)) &&
         (uVar2 = (ulong)*(ushort *)(this + lVar3 + 6), uVar2 != 0)) {
        bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVectorOrString<unsigned_int>
                          (verifier,(uint8_t *)(this + *(uint *)(this + uVar2) + uVar2),4,
                           (size_t *)0x0);
        if (!bVar1) {
          return false;
        }
        lVar3 = -(long)*(int *)this;
      }
      if ((*(ushort *)(this + lVar3) < 7) ||
         (uVar2 = (ulong)*(ushort *)(this + lVar3 + 6), uVar2 == 0)) {
        vec = (Vector<flatbuffers::Offset<reflection::RPCCall>,_unsigned_int> *)0x0;
      }
      else {
        vec = (Vector<flatbuffers::Offset<reflection::RPCCall>,_unsigned_int> *)
              (this + *(uint *)(this + uVar2) + uVar2);
      }
      bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVectorOfTables<reflection::RPCCall>
                        (verifier,vec);
      if ((bVar1) &&
         (bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>(&this->super_Table,verifier,8),
         bVar1)) {
        lVar3 = -(long)*(int *)this;
        if ((8 < *(ushort *)(this + -(long)*(int *)this)) &&
           (uVar2 = (ulong)*(ushort *)(this + lVar3 + 8), uVar2 != 0)) {
          bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVectorOrString<unsigned_int>
                            (verifier,(uint8_t *)(this + *(uint *)(this + uVar2) + uVar2),4,
                             (size_t *)0x0);
          if (!bVar1) {
            return false;
          }
          lVar3 = -(long)*(int *)this;
        }
        if ((*(ushort *)(this + lVar3) < 9) ||
           (uVar2 = (ulong)*(ushort *)(this + lVar3 + 8), uVar2 == 0)) {
          vec_00 = (Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *)0x0;
        }
        else {
          vec_00 = (Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *)
                   (this + *(uint *)(this + uVar2) + uVar2);
        }
        bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVectorOfTables<reflection::KeyValue>
                          (verifier,vec_00);
        if ((bVar1) &&
           (bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>(&this->super_Table,verifier,10),
           bVar1)) {
          lVar3 = -(long)*(int *)this;
          if ((10 < *(ushort *)(this + -(long)*(int *)this)) &&
             (uVar2 = (ulong)*(ushort *)(this + lVar3 + 10), uVar2 != 0)) {
            bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVectorOrString<unsigned_int>
                              (verifier,(uint8_t *)(this + *(uint *)(this + uVar2) + uVar2),4,
                               (size_t *)0x0);
            if (!bVar1) {
              return false;
            }
            lVar3 = -(long)*(int *)this;
          }
          if ((*(ushort *)(this + lVar3) < 0xb) ||
             (uVar2 = (ulong)*(ushort *)(this + lVar3 + 10), uVar2 == 0)) {
            vec_01 = (Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *)0x0;
          }
          else {
            vec_01 = (Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *)
                     (this + *(uint *)(this + uVar2) + uVar2);
          }
          bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVectorOfStrings(verifier,vec_01);
          if ((bVar1) &&
             (bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>
                                (&this->super_Table,verifier,0xc), bVar1)) {
            if ((*(ushort *)(this + -(long)*(int *)this) < 0xd) ||
               (uVar2 = (ulong)*(ushort *)(this + (0xc - (long)*(int *)this)), uVar2 == 0)) {
              pSVar4 = (String *)0x0;
            }
            else {
              pSVar4 = (String *)(this + *(uint *)(this + uVar2) + uVar2);
            }
            bVar1 = flatbuffers::VerifierTemplate<false>::VerifyString(verifier,pSVar4);
            if (bVar1) {
              verifier->depth_ = verifier->depth_ - 1;
              return true;
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool Verify(::flatbuffers::Verifier &verifier) const {
    return VerifyTableStart(verifier) &&
           VerifyOffsetRequired(verifier, VT_NAME) &&
           verifier.VerifyString(name()) &&
           VerifyOffset(verifier, VT_CALLS) &&
           verifier.VerifyVector(calls()) &&
           verifier.VerifyVectorOfTables(calls()) &&
           VerifyOffset(verifier, VT_ATTRIBUTES) &&
           verifier.VerifyVector(attributes()) &&
           verifier.VerifyVectorOfTables(attributes()) &&
           VerifyOffset(verifier, VT_DOCUMENTATION) &&
           verifier.VerifyVector(documentation()) &&
           verifier.VerifyVectorOfStrings(documentation()) &&
           VerifyOffset(verifier, VT_DECLARATION_FILE) &&
           verifier.VerifyString(declaration_file()) &&
           verifier.EndTable();
  }